

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O3

FloatParts pick_nan_muladd(FloatParts a,FloatParts b,FloatParts c,_Bool inf_zero,float_status *s)

{
  byte *pbVar1;
  ulong uVar2;
  uint uVar3;
  FloatParts FVar4;
  undefined7 in_stack_00000009;
  
  if ((c._8_8_ & 0xff00000000) == 0x500000000 ||
      ((b._8_8_ & 0xff00000000) == 0x500000000 || a.cls == float_class_snan)) {
    pbVar1 = (byte *)(CONCAT71(in_stack_00000009,inf_zero) + 2);
    *pbVar1 = *pbVar1 | 1;
  }
  uVar3 = (((undefined1  [16])b & (undefined1  [16])0xfc00000000) == (undefined1  [16])0x0) + 1;
  if (float_class_inf < a.cls) {
    uVar3 = 0;
  }
  uVar2 = 3;
  if (*(char *)(CONCAT71(in_stack_00000009,inf_zero) + 6) == '\0') {
    uVar2 = (ulong)uVar3;
  }
  FVar4 = (FloatParts)(*(code *)(&DAT_00dc68b0 + *(int *)(&DAT_00dc68b0 + uVar2 * 4)))(a.frac);
  return FVar4;
}

Assistant:

static FloatParts pick_nan_muladd(FloatParts a, FloatParts b, FloatParts c,
                                  bool inf_zero, float_status *s)
{
    int which;

    if (is_snan(a.cls) || is_snan(b.cls) || is_snan(c.cls)) {
        s->float_exception_flags |= float_flag_invalid;
    }

    which = pickNaNMulAdd(a.cls, b.cls, c.cls, inf_zero, s);

    if (s->default_nan_mode) {
        /* Note that this check is after pickNaNMulAdd so that function
         * has an opportunity to set the Invalid flag.
         */
        which = 3;
    }

    switch (which) {
    case 0:
        break;
    case 1:
        a = b;
        break;
    case 2:
        a = c;
        break;
    case 3:
        return parts_default_nan(s);
    default:
        g_assert_not_reached();
        break;
    }

    if (is_snan(a.cls)) {
        return parts_silence_nan(a, s);
    }
    return a;
}